

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_variable_decl(gvisitor_t *self,gnode_variable_decl_t *node)

{
  uint16_t nlocals;
  gravity_function_t *f;
  gravity_vm *vm;
  ulong *puVar1;
  long *plVar2;
  long lVar3;
  uint16_t uVar4;
  int iVar5;
  uint32_t uVar6;
  ircode_t *piVar7;
  gravity_function_t *f_00;
  void *pvVar8;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar9;
  gnode_t *pgVar10;
  long lVar11;
  ulong uVar12;
  gravity_function_t *c;
  long lVar13;
  long lVar14;
  gnode_t *pgVar15;
  uint32_t uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t gVar23;
  gnode_function_decl_t *f1 [2];
  void *local_78 [3];
  gnode_variable_decl_t *local_60;
  gravity_class_t *local_58;
  gravity_class_t *local_50;
  long local_48 [3];
  
  if (node->storage != TOK_KEY_EXTERN) {
    f = *(gravity_function_t **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
    if (f->isa == gravity_class_function) {
      iVar5 = string_cmp(f->identifier,"$moduleinit");
      bVar20 = iVar5 == 0;
    }
    else {
      bVar20 = false;
    }
    local_50 = f->isa;
    local_58 = gravity_class_class;
    bVar21 = local_50 == gravity_class_class;
    if (node->decls == (gnode_r *)0x0) {
      uVar17 = 0;
    }
    else {
      uVar17 = node->decls->n;
    }
    if (uVar17 != 0) {
      uVar12 = 0;
      local_60 = node;
      do {
        if (uVar12 < node->decls->n) {
          pgVar10 = node->decls->p[uVar12];
        }
        else {
          pgVar10 = (gnode_t *)0x0;
        }
        if ((bool)(bVar21 | bVar20)) {
          if (bVar20) {
            piVar7 = (ircode_t *)(f->field_9).field_0.bytecode;
            vm = *(gravity_vm **)((long)self->data + 0x38);
            gVar23 = gravity_string_to_value
                               ((gravity_vm *)0x0,*(char **)&pgVar10[1].block_length,0xffffffff);
            uVar4 = gravity_function_cpool_add(vm,f,gVar23);
            pgVar10 = *(gnode_t **)&pgVar10[1].token.colno;
            if (pgVar10 == (gnode_t *)0x0) {
              if (node == (gnode_variable_decl_t *)0x0) {
                uVar6 = 0;
              }
              else {
                uVar6 = (node->base).token.lineno;
              }
              ircode_add_constant(piVar7,0x1002,uVar6);
            }
            else {
              gvisit(self,pgVar10);
            }
            uVar6 = ircode_register_pop(piVar7);
            if (uVar6 == 0xffffffff) {
              report_error(self,&node->base,"Invalid var expression.");
            }
            if (node == (gnode_variable_decl_t *)0x0) {
              uVar16 = 0;
            }
            else {
              uVar16 = (node->base).token.lineno;
            }
            ircode_add(piVar7,STOREG,uVar6,(uint)uVar4,0,uVar16);
          }
          else {
            if (local_50 != local_58) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                            ,0x4e9,"void visit_variable_decl(gvisitor_t *, gnode_variable_decl_t *)"
                           );
            }
            c = f;
            if (node->storage == TOK_KEY_STATIC) {
              c = (gravity_function_t *)f->xdata;
            }
            lVar11 = *(long *)&pgVar10[1].token.colno;
            if ((lVar11 == 0) || (*(char *)((long)&pgVar10[1].token.length + 3) != '\x01')) {
              if (node->access == TOK_KEY_PUBLIC) {
                aVar9.p = (gravity_object_t *)
                          gravity_function_new_special
                                    ((gravity_vm *)0x0,(char *)0x0,(uint16_t)pgVar10[1].token.length
                                     ,(void *)0x0,(void *)0x0);
                gVar23.field_1.p = (gravity_object_t *)aVar9.n;
                gVar23.isa = (aVar9.p)->isa;
                gravity_class_bind((gravity_class_t *)c,*(char **)&pgVar10[1].block_length,gVar23);
              }
              lVar13._0_4_ = pgVar10[1].token.colno;
              lVar13._4_4_ = pgVar10[1].token.position;
              if (lVar13 != 0) {
                aVar9.p = (gravity_object_t *)class_lookup_nosuper((gravity_class_t *)c,"$init");
                if ((gravity_function_t *)aVar9.n == (gravity_function_t *)0x0) {
                  piVar7 = ircode_create(1);
                  aVar9.p = (gravity_object_t *)
                            gravity_function_new((gravity_vm *)0x0,"$init",1,0,0,piVar7);
                  value.field_1.p = (gravity_object_t *)aVar9.n;
                  value.isa = (aVar9.p)->isa;
                  gravity_class_bind((gravity_class_t *)c,"$init",value);
                }
                plVar2 = (long *)self->data;
                lVar11 = plVar2[1];
                if (*plVar2 == lVar11) {
                  lVar13 = lVar11 * 2;
                  if (lVar11 == 0) {
                    lVar13 = 8;
                  }
                  plVar2[1] = lVar13;
                  pvVar8 = realloc((void *)plVar2[2],lVar13 << 3);
                  *(void **)((long)self->data + 0x10) = pvVar8;
                }
                plVar2 = (long *)self->data;
                lVar11 = *plVar2;
                *plVar2 = lVar11 + 1;
                ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(plVar2[2] + lVar11 * 8))->p =
                     (gravity_object_t *)aVar9;
                piVar7 = *(ircode_t **)(aVar9.n + 0xa0);
                gvisit(self,*(gnode_t **)&pgVar10[1].token.colno);
                uVar6 = ircode_register_pop(piVar7);
                if (uVar6 == 0xffffffff) {
                  report_error(self,&node->base,"Invalid var expression.");
                }
                if (node == (gnode_variable_decl_t *)0x0) {
                  uVar16 = 0;
                }
                else {
                  uVar16 = (node->base).token.lineno;
                }
                ircode_add(piVar7,STORE,uVar6,0,(ushort)pgVar10[1].token.length + 0x100,uVar16);
                *(long *)self->data = *self->data + -1;
              }
            }
            else {
              puVar1 = *(ulong **)(lVar11 + 0x50);
              if (*puVar1 == 0) {
                local_48[0] = 0;
              }
              else {
                local_48[0] = *(long *)puVar1[2];
              }
              if (*puVar1 < 2) {
                local_48[1] = 0;
              }
              else {
                local_48[1] = *(undefined8 *)(puVar1[2] + 8);
              }
              local_78[0] = (void *)0x0;
              local_78[1] = (void *)0x0;
              lVar11 = 0;
              do {
                lVar13 = local_48[lVar11];
                if (lVar13 != 0) {
                  if (*(uint16_t **)(lVar13 + 0x68) == (uint16_t *)0x0) {
                    uVar4 = 0;
                  }
                  else {
                    uVar4 = **(uint16_t **)(lVar13 + 0x68);
                  }
                  nlocals = *(uint16_t *)(lVar13 + 0x78);
                  piVar7 = ircode_create(uVar4 + nlocals);
                  f_00 = gravity_function_new((gravity_vm *)0x0,(char *)0x0,uVar4,nlocals,0,piVar7);
                  local_78[lVar11] = f_00;
                  plVar2 = (long *)self->data;
                  lVar3 = plVar2[1];
                  if (*plVar2 == lVar3) {
                    lVar14 = lVar3 * 2;
                    if (lVar3 == 0) {
                      lVar14 = 8;
                    }
                    plVar2[1] = lVar14;
                    pvVar8 = realloc((void *)plVar2[2],lVar14 << 3);
                    *(void **)((long)self->data + 0x10) = pvVar8;
                  }
                  plVar2 = (long *)self->data;
                  lVar3 = *plVar2;
                  *plVar2 = lVar3 + 1;
                  *(gravity_function_t **)(plVar2[2] + lVar3 * 8) = f_00;
                  lVar13 = *(long *)(lVar13 + 0x70);
                  if (lVar13 != 0) {
                    if (*(ulong **)(lVar13 + 0x50) == (ulong *)0x0) {
                      uVar18 = 0;
                    }
                    else {
                      uVar18 = **(ulong **)(lVar13 + 0x50);
                    }
                    if (uVar18 != 0) {
                      uVar19 = 0;
                      do {
                        if (uVar19 < **(ulong **)(lVar13 + 0x50)) {
                          pgVar15 = *(gnode_t **)((*(ulong **)(lVar13 + 0x50))[2] + uVar19 * 8);
                        }
                        else {
                          pgVar15 = (gnode_t *)0x0;
                        }
                        gvisit(self,pgVar15);
                        uVar19 = uVar19 + 1;
                      } while (uVar18 != uVar19);
                    }
                  }
                  *(long *)self->data = *self->data + -1;
                  gravity_optimizer(f_00,self->bflag);
                }
                bVar22 = lVar11 == 0;
                lVar11 = lVar11 + 1;
              } while (bVar22);
              aVar9.p = (gravity_object_t *)
                        gravity_function_new_special
                                  ((gravity_vm *)0x0,(char *)0x0,0xfffe,local_78[0],local_78[1]);
              value_00.field_1.p = (gravity_object_t *)aVar9.n;
              value_00.isa = (aVar9.p)->isa;
              gravity_class_bind((gravity_class_t *)c,*(char **)&pgVar10[1].block_length,value_00);
              node = local_60;
            }
          }
        }
        else {
          pgVar15 = *(gnode_t **)&pgVar10[1].token.colno;
          if (pgVar15 != (gnode_t *)0x0) {
            if (pgVar15->tag == NODE_ENUM_DECL) goto LAB_0013b322;
            if (pgVar15 != (gnode_t *)0x0) {
              gvisit(self,pgVar15);
            }
          }
          piVar7 = (ircode_t *)(f->field_9).field_0.bytecode;
          lVar11._0_4_ = pgVar10[1].token.colno;
          lVar11._4_4_ = pgVar10[1].token.position;
          if (lVar11 == 0) {
            if (node == (gnode_variable_decl_t *)0x0) {
              uVar6 = 0;
            }
            else {
              uVar6 = (node->base).token.lineno;
            }
            ircode_add(piVar7,LOADK,(uint)(ushort)pgVar10[1].token.length,0x1002,0,uVar6);
          }
          else {
            uVar6 = ircode_register_pop(piVar7);
            if (uVar6 == 0xffffffff) {
              report_error(self,&node->base,"Invalid var expression.");
            }
            if (node == (gnode_variable_decl_t *)0x0) {
              uVar16 = 0;
            }
            else {
              uVar16 = (node->base).token.lineno;
            }
            ircode_add(piVar7,MOVE,(uint)(ushort)pgVar10[1].token.length,uVar6,0,uVar16);
            ircode_add_check(piVar7);
          }
        }
LAB_0013b322:
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar17);
    }
  }
  return;
}

Assistant:

static void visit_variable_decl (gvisitor_t *self, gnode_variable_decl_t *node) {
    DEBUG_CODEGEN("visit_variable_decl");
    DECLARE_CONTEXT();

    // no initialization for extern variables since the real value will be provided at runtime
    if (node->storage == TOK_KEY_EXTERN) return;

    bool is_module = CONTEXT_IS_MODULE(context_object);
    bool is_class = OBJECT_ISA_CLASS(context_object);
    bool is_local = ((is_module == false) && (is_class == false));

    // loop through declarations
    size_t count = gnode_array_size(node->decls);
    for (size_t i=0; i<count; ++i) {
        gnode_var_t *p = (gnode_var_t *)gnode_array_get(node->decls, i);
        DEBUG_CODEGEN("visit_variable_decl %s", p->identifier);

        // variable declarations can be specified in:
        // FUNCTION (local variable)
        // MODULE (module variable)
        // CLASS (property)

        if (is_local) {
            // it is a local variable declaration (default initialized to NULL)
            // code is generate ONLY if an init expression is specified
            //
            //    example:
            //
            //    func foo () {
            //        var a = 10;
            //    }
            //
            //    LOADI    1 10    ; move 10 into register 1
            //    MOVE    0 1        ; move register 1 into register 0
            //

            // generate expression code (if it is not a local enum)
            if (NODE_ISA(p->expr, NODE_ENUM_DECL)) continue;
            if (p->expr) visit(p->expr); // context is a function

            gravity_function_t *context_function = (gravity_function_t *)context_object;
            ircode_t *code = (ircode_t *)context_function->bytecode;
            if (p->expr) {
                // assign to variable result of the expression
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
				ircode_add(code, MOVE, p->index, reg, 0, LINE_NUMBER(node));
                // Checkpoint added to support STRUCT
                ircode_add_check(code);
            } else {
                // no default assignment expression found so initialize to NULL
				ircode_add(code, LOADK, p->index, CPOOL_VALUE_NULL, 0, LINE_NUMBER(node));
            }
            continue;
        }

        if (is_module) {
            // it is a module variable (default initialized to null)
            // code must ALWAYS be generated
            //
            // example 1:
            //    var a;
            //
            //    LOADK    0 NULL   ; move null into register 0
            //    STOREG    0 0     ; move register 0 into hash(constant_pool(0))
            //
            // example 2:
            //    var a = 10;
            //
            //    LOADI    0 10     ; move 10 into register 0
            //    STOREG    0 0     ; move register 0 into hash(constant_pool(0))
            //

            gravity_function_t *context_function = (gravity_function_t *)context_object;
            ircode_t *code = (ircode_t *)context_function->bytecode;
            uint16_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, p->identifier));

            if (p->expr) {
                visit(p->expr); // context is a function
            } else {
				ircode_add_constant(code, CPOOL_VALUE_NULL, LINE_NUMBER(node));
            }
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
			ircode_add(code, STOREG, reg, index, 0, LINE_NUMBER(node));
            continue;
        }

        if (is_class) {
            bool is_static = (node->storage == TOK_KEY_STATIC);
            gravity_class_t *context_class = (is_static) ? ((gravity_class_t *)context_object)->objclass : (gravity_class_t *)context_object;

            // check computed property case first
            if ((p->expr) && (p->iscomputed)) {
                process_getter_setter(self, p, context_class);
                continue;
            }

            // create ivar first
            uint16_t ivar_index = (p->index >= 0) ? p->index : gravity_class_add_ivar(context_class, NULL);

            // add default getter and setter ONLY if property is public
            if (node->access == TOK_KEY_PUBLIC) {
                // since getter and setter are methods and not simple functions, do not transfer to VM
                gravity_function_t *f = gravity_function_new_special(NULL, NULL, ivar_index, NULL, NULL); // getter and setter NULL means default
                gravity_class_bind(context_class, p->identifier, VALUE_FROM_OBJECT(f));
            }
            DEBUG_CODEGEN("Class: %s (static: %d) property: %s index: %d", context_class->identifier, is_static, p->identifier, ivar_index);

            // it is a property (default initialized to null)
            // code must be generated ONLY if an init expression is specified

            //
            //  example:
            //     class foo {
            //         var a = 10;
            //     }
            //
            //  get $init function
            //  depending if variable has been created static
            //  and push it as current declaration then:
            //
            //     LOADI     0 10   ; move 10 into register 0
            //     STOREF    0 0    ; move register 0 into property 0

            if (p->expr) {
                // was gravity_class_lookup but that means than $init or init will be recursively searched also in super classes
                gravity_function_t *init_function = class_lookup_nosuper(context_class, CLASS_INTERNAL_INIT_NAME);
                if (init_function == NULL) {
                    // no $init method found so create a new one
                    init_function = gravity_function_new (NULL, CLASS_INTERNAL_INIT_NAME, 1, 0, 0, ircode_create(1));
                    gravity_class_bind(context_class, CLASS_INTERNAL_INIT_NAME, VALUE_FROM_OBJECT(init_function));
                }

                CONTEXT_PUSH(init_function);
                ircode_t *code = (ircode_t *)init_function->bytecode;
                visit(p->expr);
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
				ircode_add(code, STORE, reg, 0, p->index + MAX_REGISTERS, LINE_NUMBER(node));
                CONTEXT_POP();
            }

            continue;
        }

        // should never reach this point
        assert(0);
    }
}